

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test3::writeMainBody
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  bool bVar1;
  pointer puVar2;
  ostream *poVar3;
  GLdouble GVar4;
  uint local_3c;
  const_iterator cStack_38;
  GLuint element;
  const_iterator end;
  const_iterator it;
  GLchar *varying_name;
  GLuint type_ordinal;
  shaderStage shader_stage_local;
  ostream *stream_local;
  GPUShaderFP64Test3 *this_local;
  
  varying_name._0_4_ = 1;
  it._M_current = (uniformDetails *)anon_var_dwarf_3d91;
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    it._M_current = (uniformDetails *)m_varying_name_fs_out_fs_result;
    break;
  case GEOMETRY_SHADER:
    it._M_current = (uniformDetails *)m_varying_name_gs_fs_gs_result;
    break;
  case TESS_CONTROL_SHADER:
    it._M_current = (uniformDetails *)m_varying_name_tcs_tes_tcs_result;
    break;
  case TESS_EVAL_SHADER:
    it._M_current = (uniformDetails *)m_varying_name_tes_gs_tes_result;
    break;
  case VERTEX_SHADER:
    it._M_current = (uniformDetails *)m_varying_name_vs_tcs_vs_result;
  }
  std::operator<<(stream,"void main()\n{\n");
  if (shader_stage == TESS_CONTROL_SHADER) {
    std::operator<<(stream,
                    "gl_TessLevelOuter[0] = 1.0;\ngl_TessLevelOuter[1] = 1.0;\ngl_TessLevelOuter[2] = 1.0;\ngl_TessLevelOuter[3] = 1.0;\ngl_TessLevelInner[0] = 1.0;\ngl_TessLevelInner[1] = 1.0;\n\n"
                   );
  }
  end = std::
        vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
        ::begin(&this->m_uniform_details);
  cStack_38 = std::
              vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
              ::end(&this->m_uniform_details);
  while (bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffc8,&end), bVar1) {
    std::operator<<(stream,"    ");
    if ((GLuint)varying_name != 1) {
      std::operator<<(stream,"else ");
    }
    poVar3 = std::operator<<(stream,"if (");
    puVar2 = __gnu_cxx::
             __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
             ::operator->(&end);
    poVar3 = std::operator<<(poVar3,puVar2->m_type_name);
    std::operator<<(poVar3,"(");
    for (local_3c = 0;
        puVar2 = __gnu_cxx::
                 __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                 ::operator->(&end), local_3c < puVar2->m_n_elements; local_3c = local_3c + 1) {
      GVar4 = getExpectedValue(this,(GLuint)varying_name,local_3c);
      std::ostream::operator<<(stream,GVar4);
      puVar2 = __gnu_cxx::
               __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
               ::operator->(&end);
      if (puVar2->m_n_elements != local_3c + 1) {
        std::operator<<(stream,", ");
      }
    }
    poVar3 = std::operator<<(stream,") != ");
    poVar3 = std::operator<<(poVar3,m_uniform_block_instance_name);
    poVar3 = std::operator<<(poVar3,".");
    puVar2 = __gnu_cxx::
             __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
             ::operator->(&end);
    poVar3 = std::operator<<(poVar3,puVar2->m_name);
    poVar3 = std::operator<<(poVar3,")\n    {\n        ");
    std::operator<<(poVar3,(char *)it._M_current);
    if (shader_stage == TESS_CONTROL_SHADER) {
      std::operator<<(stream,"[gl_InvocationID]");
    }
    poVar3 = std::operator<<(stream," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    poVar3 = std::operator<<(poVar3,";\n");
    std::operator<<(poVar3,"    }\n");
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
    ::operator++(&end);
    varying_name._0_4_ = (GLuint)varying_name + 1;
  }
  poVar3 = std::operator<<(stream,"    else\n    {\n        ");
  std::operator<<(poVar3,(char *)it._M_current);
  if (shader_stage == TESS_CONTROL_SHADER) {
    std::operator<<(stream,"[gl_InvocationID]");
  }
  poVar3 = std::operator<<(stream," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  poVar3 = std::operator<<(poVar3,";\n");
  poVar3 = std::operator<<(poVar3,"    }\n");
  std::operator<<(poVar3,"\n");
  writeVaryingPassthrough(this,stream,shader_stage);
  if (shader_stage == GEOMETRY_SHADER) {
    std::operator<<(stream,
                    "\ngl_Position = vec4(0.0f, 0.0f, 0.0f, 1.0f);EmitVertex();\nEndPrimitive();\n")
    ;
  }
  std::operator<<(stream,"}\n\n");
  return;
}

Assistant:

void GPUShaderFP64Test3::writeMainBody(std::ostream& stream, shaderStage shader_stage) const
{
	glw::GLuint		   type_ordinal = 1;
	const glw::GLchar* varying_name = "";

	/* Select name for varying that will hold result of "that" shader_stage */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		varying_name = m_varying_name_fs_out_fs_result;
		break;
	case GEOMETRY_SHADER:
		varying_name = m_varying_name_gs_fs_gs_result;
		break;
	case TESS_CONTROL_SHADER:
		varying_name = m_varying_name_tcs_tes_tcs_result;
		break;
	case TESS_EVAL_SHADER:
		varying_name = m_varying_name_tes_gs_tes_result;
		break;
	case VERTEX_SHADER:
		varying_name = m_varying_name_vs_tcs_vs_result;
		break;
	}

	/* void main() */
	stream << "void main()\n"
			  "{\n";

	/* Tesselation levels output */
	if (TESS_CONTROL_SHADER == shader_stage)
	{
		stream << "gl_TessLevelOuter[0] = 1.0;\n"
				  "gl_TessLevelOuter[1] = 1.0;\n"
				  "gl_TessLevelOuter[2] = 1.0;\n"
				  "gl_TessLevelOuter[3] = 1.0;\n"
				  "gl_TessLevelInner[0] = 1.0;\n"
				  "gl_TessLevelInner[1] = 1.0;\n"
				  "\n";
	}

	/* For each "double precision" uniform
	 *
	 * [else] if (TYPE_NAME(PREDIFINED_VALUES) != NAMED_UNIFORM_BLOCK_NAME.UNIFORM_NAME)
	 * {
	 *     VARYING_NAME = m_result_failure;
	 * }
	 */
	for (std::vector<uniformDetails>::const_iterator it = m_uniform_details.begin(), end = m_uniform_details.end();
		 end != it; ++it, ++type_ordinal)
	{
		stream << "    ";

		/* First comparison is done with if, next with else if */
		if (1 != type_ordinal)
		{
			stream << "else ";
		}

		/* if (TYPE_NAME( */
		stream << "if (" << it->m_type_name << "(";

		/* PREDIFINED_VALUES */
		for (glw::GLuint element = 0; element < it->m_n_elements; ++element)
		{
			stream << getExpectedValue(type_ordinal, element);

			/* Separate with comma */
			if (it->m_n_elements != element + 1)
			{
				stream << ", ";
			}
		}

		/*
		 * ) != NAMED_UNIFORM_BLOCK_NAME.UNIFORM_NAME)
		 * {
		 *     VARYING_NAME
		 */
		stream << ") != " << m_uniform_block_instance_name << "." << it->m_name << ")\n"
																				   "    {\n"
																				   "        "
			   << varying_name;

		/* Tesselation control outputs have to be arrays indexed with gl_InvocationID */
		if (TESS_CONTROL_SHADER == shader_stage)
		{
			stream << "[gl_InvocationID]";
		}

		/*
		 * = m_result_failure;
		 * }
		 */
		stream << " = " << m_result_failure << ";\n"
			   << "    }\n";
	}

	/* If all comparisons are ok
	 *
	 *     else
	 *     {
	 *         VARYING_NAME = m_result_success;
	 *     }
	 */

	/*
	 * else
	 * {
	 *     VARYING_NAME
	 */
	stream << "    else\n"
			  "    {\n"
			  "        "
		   << varying_name;

	/* Tesselation control outputs have to be arrays indexed with gl_InvocationID */
	if (TESS_CONTROL_SHADER == shader_stage)
	{
		stream << "[gl_InvocationID]";
	}

	/*
	 * = m_result_success;
	 * }
	 *
	 */
	stream << " = " << m_result_success << ";\n"
		   << "    }\n"
		   << "\n";

	/* For each pair of "input/output" varyings
	 *
	 * OUTPUT_VARYING_NAME = INPUT_VARYING_NAME;
	 **/
	writeVaryingPassthrough(stream, shader_stage);

	/* Geometry shader have to emit vertex */
	if (GEOMETRY_SHADER == shader_stage)
	{
		stream << "\n"
				  "gl_Position = vec4(0.0f, 0.0f, 0.0f, 1.0f);"
				  "EmitVertex();\n"
				  "EndPrimitive();\n";
	}

	/* Close scope of main */
	stream << "}\n\n";
}